

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::emit_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  char *pcVar1;
  StorageClass SVar2;
  uint uVar3;
  undefined8 *puVar4;
  char cVar5;
  code *pcVar6;
  Id type_id;
  ResourceMeta *meta;
  bool bVar7;
  ComponentType element_type;
  byte bVar8;
  undefined1 uVar9;
  Id IVar10;
  RawWidth width;
  TypeID TVar11;
  Id IVar12;
  Op OVar13;
  Op OVar14;
  CallInst *pCVar15;
  Value *pVVar16;
  mapped_type *pmVar17;
  LoggingCallback p_Var18;
  Type *pTVar19;
  Type *element_type_00;
  BufferAccessInfo BVar20;
  Operation *pOVar21;
  Operation *pOVar22;
  int *piVar23;
  void *pvVar24;
  long lVar25;
  uint *puVar26;
  undefined2 uVar27;
  uint uVar28;
  ulong extraout_RDX;
  ulong uVar29;
  int iVar30;
  Impl *this;
  Builder *pBVar31;
  code **ppcVar32;
  uint32_t access_mask;
  undefined8 *puVar33;
  uint uVar34;
  Impl *pIVar35;
  char in_R10B;
  Impl *pIVar36;
  ulong uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  pair<std::_Rb_tree_iterator<spv::Capability>,_bool> pVar40;
  RawAccessChain RVar41;
  Id image_id;
  Id component_ids [4];
  char buffer [4096];
  code *apcStack_10d8 [2];
  undefined8 uStack_10c8;
  uint local_10c0;
  char local_10b9;
  undefined8 local_10b8;
  undefined8 local_10b0;
  Id local_10a8;
  Id local_10a4;
  Builder *local_10a0;
  CallInst *local_1098;
  Type *local_1090;
  Type *local_1088;
  ulong local_1080;
  mapped_type *local_1078;
  uint local_1070;
  Id local_106c;
  Value local_1068;
  BufferAccessInfo local_1050;
  undefined1 local_1048 [16];
  Vector<spv::Id> local_1038;
  undefined1 uStack_1020;
  undefined2 uStack_101f;
  undefined5 uStack_101d;
  undefined1 uStack_1018;
  undefined2 uStack_1017;
  undefined6 uStack_1015;
  undefined2 uStack_100f;
  Id *ids;
  
  bVar8 = 0;
  if ((impl->ags).num_instructions == 1) {
    apcStack_10d8[1] = (code *)0x1760eb;
    pCVar15 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    if (pCVar15 == (impl->ags).backdoor_instructions[0]) {
      apcStack_10d8[1] = (code *)0x1763fa;
      pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      apcStack_10d8[1] = (code *)0x176407;
      IVar10 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
      (impl->ags).active_uav_ptr = IVar10;
      (impl->ags).active_uav_op = BufferLoad;
      (impl->ags).active_read_backdoor = (Value *)instruction;
      return true;
    }
  }
  apcStack_10d8[1] = (code *)0x176103;
  bVar7 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar7) {
    return true;
  }
  apcStack_10d8[1] = (code *)0x176117;
  local_10a0 = Converter::Impl::builder(impl);
  access_mask = 1;
  apcStack_10d8[1] = (code *)0x17612e;
  pVVar16 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  apcStack_10d8[1] = (code *)0x17613b;
  local_10a4 = Converter::Impl::get_id_for_value(impl,pVVar16,0);
  apcStack_10d8[1] = (code *)0x17614c;
  IVar10 = Converter::Impl::get_type_id(impl,local_10a4);
  apcStack_10d8[1] = (code *)0x17615e;
  pmVar17 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_10a4);
  apcStack_10d8[1] = (code *)0x176178;
  local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)instruction;
  local_1078 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)&local_1038);
  uVar34 = local_1078->access_mask;
  if (pmVar17->storage != StorageClassUniformConstant) {
    uVar28 = (uVar34 & 0xf) >> 1 | uVar34 & 0xf;
    access_mask = uVar28 >> 2 | uVar28;
  }
  local_10b0 = pmVar17;
  if (pmVar17->storage == StorageClassPhysicalStorageBuffer) {
    if ((uVar34 & 0x10) == 0) {
      apcStack_10d8[1] = (code *)0x176441;
      bVar7 = emit_physical_buffer_load_instruction
                        (impl,instruction,&pmVar17->physical_pointer_meta,access_mask,4);
      return bVar7;
    }
    apcStack_10d8[1] = (code *)0x1761b3;
    p_Var18 = get_thread_log_callback();
    if (p_Var18 == (LoggingCallback)0x0) {
      apcStack_10d8[1] = (code *)0x176e2f;
      emit_buffer_load_instruction();
      return false;
    }
    uStack_1018 = 99;
    uStack_1017 = 0x2e6b;
    uStack_1015 = 0xa283a3e20;
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x737261707320646e;
    uStack_1020 = 0x65;
    uStack_101f = 0x6620;
    uStack_101d = 0x6162646565;
    uVar38._0_1_ = 's';
    uVar38._1_1_ = 'e';
    uVar38._2_1_ = ' ';
    uVar38._3_1_ = 'B';
    uVar39._0_1_ = 'D';
    uVar39._1_1_ = 'A';
    uVar39._2_1_ = ' ';
    uVar39._3_1_ = 'a';
    goto LAB_00176809;
  }
  apcStack_10d8[1] = (code *)0x1761f8;
  emit_buffer_synchronization_validation(impl,instruction,Load);
  if (((impl->options).nv_raw_access_chains == true) &&
     ((local_10b0->storage == StorageClassPhysicalStorageBuffer ||
      local_10b0->storage == StorageClassStorageBuffer) && (char)((uVar34 & 0x10) >> 4) == '\0')) {
    apcStack_10d8[1] = (code *)0x1764bf;
    pTVar19 = LLVMBC::Value::getType((Value *)instruction);
    uVar34 = 0;
    apcStack_10d8[1] = (code *)0x1764cb;
    pmVar17 = (mapped_type *)LLVMBC::Type::getStructElementType(pTVar19,0);
    uVar28 = 1;
    do {
      uVar3 = uVar34 & 0x1f;
      uVar34 = uVar34 + 1;
      if ((local_1078->access_mask >> uVar3 & 1) != 0) {
        uVar28 = uVar34;
      }
    } while (uVar34 != 4);
    apcStack_10d8[1] = (code *)0x176500;
    RVar41 = emit_raw_access_chain(impl,local_10b0,instruction,(Type *)pmVar17,uVar28);
    apcStack_10d8[1] = (code *)0x176521;
    local_10b0 = pmVar17;
    pOVar22 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,RVar41.vector_type_id);
    apcStack_10d8[1] = (code *)0x17652e;
    Operation::add_id(pOVar22,RVar41.ptr_id);
    apcStack_10d8[1] = (code *)0x17653b;
    Operation::add_literal(pOVar22,2);
    pmVar17 = local_10b0;
    apcStack_10d8[1] = (code *)0x17654f;
    Operation::add_literal(pOVar22,RVar41.alignment);
    apcStack_10d8[1] = (code *)0x17655c;
    Converter::Impl::add(impl,pOVar22,false);
    apcStack_10d8[1] = (code *)0x176564;
    bVar7 = type_is_16bit((Type *)pmVar17);
    if (((bVar7) && ((impl->execution_mode_meta).native_16bit_operations == false)) &&
       ((impl->options).min_precision_prefer_native_16bit == true)) {
      apcStack_10d8[1] = (code *)0x176584;
      TVar11 = LLVMBC::Type::getTypeID((Type *)pmVar17);
      bVar7 = TVar11 == HalfTyID;
      apcStack_10d8[1] = (code *)0x1765a6;
      IVar10 = Converter::Impl::get_type_id(impl,bVar7 * '\x05' + U16,1,uVar28,false);
      apcStack_10d8[1] = (code *)0x1765b2;
      pOVar21 = Converter::Impl::allocate(impl,bVar7 + 0x71 + (uint)bVar7,IVar10);
      apcStack_10d8[1] = (code *)0x1765c2;
      Operation::add_id(pOVar21,pOVar22->id);
      apcStack_10d8[1] = (code *)0x1765cf;
      Converter::Impl::add(impl,pOVar21,false);
      apcStack_10d8[1] = (code *)0x1765dd;
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar21->id);
    }
    goto LAB_00176e08;
  }
  apcStack_10d8[1] = (code *)0x176238;
  local_10a8 = IVar10;
  pTVar19 = LLVMBC::Value::getType((Value *)instruction);
  apcStack_10d8[1] = (code *)0x17624d;
  local_1048._8_8_ = impl;
  element_type_00 = LLVMBC::Type::getStructElementType(pTVar19,0);
  impl = (Impl *)local_1048._8_8_;
  meta = local_10b0;
  uStack_10c8._0_5_ = CONCAT14(local_10b0->kind,(undefined4)uStack_10c8);
  IVar10 = local_10b0->index_offset_id;
  apcStack_10d8[1] = (code *)0x17627b;
  local_10c0 = uVar34;
  local_1068.tween_id = (uint64_t)pTVar19;
  pTVar19 = LLVMBC::Type::getStructElementType(pTVar19,0);
  apcStack_10d8[1] = (code *)0x176295;
  local_1098 = instruction;
  BVar20 = build_buffer_access(impl,instruction,0,IVar10,pTVar19,access_mask);
  apcStack_10d8[1] = (code *)0x1762b0;
  local_1050 = BVar20;
  width = get_buffer_access_bits_per_component(impl,meta->storage,element_type_00);
  apcStack_10d8[1] = (code *)0x1762c0;
  local_1090 = element_type_00;
  TVar11 = LLVMBC::Type::getTypeID(element_type_00);
  puVar33 = (undefined8 *)(ulong)TVar11;
  apcStack_10d8[1] = (code *)0x1762e4;
  pIVar35 = impl;
  local_1080 = (ulong)BVar20 >> 0x20;
  local_10a4 = get_buffer_alias_handle
                         (impl,meta,local_10a4,(uint)(TVar11 == DoubleTyID),width,
                          BVar20.raw_vec_size);
  uVar29 = extraout_RDX;
  if ((local_10c0 & 0x10) != 0) {
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1038.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
    pIVar35 = (Impl *)&local_10a0->capabilities;
    apcStack_10d8[1] = (code *)0x17630e;
    pVar40 = std::
             _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
             ::_M_insert_unique<spv::Capability_const&>
                       ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                         *)pIVar35,(Capability *)&local_1038);
    uVar29 = pVar40._8_8_;
  }
  pBVar31 = local_10a0;
  if (uStack_10c8._4_1_ == '\n') {
    apcStack_10d8[1] = (code *)0x17632a;
    bVar7 = spv::Builder::isStorageImageType(local_10a0,local_10a8);
    apcStack_10d8[1] = (code *)0x17633a;
    element_type = Converter::Impl::get_effective_typed_resource_type(local_10b0->component_type);
    apcStack_10d8[1] = (code *)0x176352;
    IVar10 = Converter::Impl::get_type_id(impl,element_type,1,4,false);
    if ((local_10c0 & 0x10) == 0) {
      OVar13 = OpImageRead;
      OVar14 = OpImageFetch;
      pCVar15 = local_1098;
    }
    else {
      apcStack_10d8[1] = (code *)0x176372;
      IVar12 = spv::Builder::makeIntegerType(pBVar31,0x20,false);
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apcStack_10d8[1] = (code *)0x176398;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           &(((CallInst *)
             local_1038.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
      *(Id *)&(((CallInst *)
               local_1038.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
           IVar12;
      *(Id *)((long)&(((CallInst *)
                      local_1038.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                     type + 4) = IVar10;
      apcStack_10d8[1] = (code *)0x1763c4;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1038.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      IVar10 = Converter::Impl::get_struct_type(impl,&local_1038,0,"SparseTexel");
      pCVar15 = local_1098;
      if ((CallInst *)
          local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
        apcStack_10d8[1] = (code *)0x1763d9;
        free_in_thread(local_1038.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      OVar13 = OpImageSparseRead;
      OVar14 = OpImageSparseFetch;
    }
    uVar34 = local_10c0;
    if (bVar7) {
      OVar14 = OVar13;
    }
    apcStack_10d8[1] = (code *)0x17660c;
    pOVar22 = Converter::Impl::allocate(impl,OVar14,(Value *)pCVar15,IVar10);
    if ((uVar34 & 0x10) == 0) {
      apcStack_10d8[1] = (code *)0x17661d;
      pTVar19 = LLVMBC::Value::getType((Value *)pCVar15);
      apcStack_10d8[1] = (code *)0x176627;
      pTVar19 = LLVMBC::Type::getStructElementType(pTVar19,0);
      apcStack_10d8[1] = (code *)0x17663a;
      Converter::Impl::decorate_relaxed_precision(impl,pTVar19,pOVar22->id,true);
    }
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&local_1068;
    local_1068.type = (Type *)CONCAT44(local_1050.index_id,local_10a4);
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
    apcStack_10d8[1] = (code *)0x176668;
    Operation::add_ids(pOVar22,(initializer_list<unsigned_int> *)&local_1038);
    pmVar17 = local_10b0;
    apcStack_10d8[1] = (code *)0x17667d;
    Converter::Impl::add(impl,pOVar22,local_10b0->rov);
    if ((uVar34 & 0x10) != 0) {
      apcStack_10d8[1] = (code *)0x1766a2;
      Converter::Impl::repack_sparse_feedback
                (impl,pmVar17->component_type,4,(Value *)pCVar15,local_1090,0);
      return true;
    }
    apcStack_10d8[1] = (code *)0x1766da;
    Converter::Impl::fixup_load_type_typed
              (impl,pmVar17->component_type,4,(Value *)pCVar15,local_1090);
    apcStack_10d8[1] = (code *)0x1766ea;
    build_exploded_composite_from_vector(impl,&pCVar15->super_Instruction,4);
    return true;
  }
  uVar34 = (int)local_1080 + 1;
  ids = (Id *)(ulong)uVar34;
  this = (Impl *)0x1;
  pIVar36 = (Impl *)(ulong)uVar34;
  if (local_1080 == 0) {
    this = (Impl *)0x0;
    uVar28 = 0;
    do {
      uVar3 = uVar28 & 0x1f;
      uVar28 = uVar28 + 1;
      uVar29 = (ulong)uVar28;
      if ((local_1078->access_mask >> uVar3 & 1) != 0) {
        this = (Impl *)(ulong)uVar28;
      }
      pIVar36 = this;
    } while (uVar28 != 4);
  }
  cVar5 = (char)width * '\x02';
  uVar37 = (ulong)CONCAT31((int3)(width >> 8),cVar5 + 1U);
  local_1068.type = (Type *)0x0;
  local_1068.kind = Argument;
  local_1068._12_4_ = 0;
  uVar28 = (byte)(cVar5 + 1U) - 1;
  uVar27 = (undefined2)uVar29;
  if (TVar11 == DoubleTyID) {
    puVar26 = &switchD_00175bbf::switchdataD_001c7834;
    pCVar15 = (CallInst *)
              ((long)&switchD_00175bbf::switchdataD_001c7834 +
              (long)(int)(&switchD_00175bbf::switchdataD_001c7834)[uVar28]);
    bVar7 = pCVar15 == (CallInst *)0x0;
    switch(cVar5) {
    case '\0':
switchD_001764a9_caseD_0:
      apcStack_10d8[1] = emit_physical_buffer_load_instruction;
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    case '\x02':
      iVar30 = 0x10;
      break;
    case '\x04':
      iVar30 = 0x20;
      break;
    case '\x06':
      iVar30 = 0x40;
      break;
    case '\b':
switchD_001764a9_caseD_8:
      if (bVar7) {
LAB_001779ee:
        return (bool)(char)uVar29;
      }
      pCVar15 = (CallInst *)((ulong)pBVar31 & 0xffffffff);
code_r0x00177709:
      uVar9 = (*(code *)((long)&switchD_001766ba::switchdataD_001c7850 +
                        (long)(int)(&switchD_001766ba::switchdataD_001c7850)[(long)pCVar15]))();
      return (bool)uVar9;
    case '\n':
      goto code_r0x00177709;
    case '\f':
    case '\x0e':
    case '\x10':
      *(undefined1 *)((long)puVar33 + 0x29) = 0;
      LOCK();
      uRam0000000031008316 = 0x1c7834;
      UNLOCK();
      pcVar6 = (code *)swi(0xf8);
      lVar25 = (*pcVar6)();
      *(int *)(lVar25 + -0x73) = *(int *)(lVar25 + -0x73) + -1;
      uStack_10c8 = 0x17833f;
      __assert_fail((char *)pIVar35,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    case '\x12':
switchD_001764a9_caseD_12:
      halt_baddata();
    case '\x14':
      if (bVar7) {
        *(char *)((long)puVar33 + -0x7b) = *(char *)((long)puVar33 + -0x7b) + '4';
        bVar8 = (char)pCVar15 + cRam0000000000000000;
        pcVar1 = this[0x1ef].options.shader_source_file.field_2._M_local_buf + 0xc;
        *pcVar1 = *pcVar1 + '4';
      }
      else {
        *(char *)&(pCVar15->super_Instruction).super_Value.type =
             *(char *)&(pCVar15->super_Instruction).super_Value.type + (char)pCVar15;
        if (impl != (Impl *)0x0) {
          apcStack_10d8[1] = (code *)0x178206;
          uVar34 = raw_width_to_bits(local_10b0._4_4_);
          pBVar31 = (Builder *)CONCAT44(local_10a4,local_10a8);
          if ((int)local_10a0 == 4) {
            apcStack_10d8[1] = (code *)0x17821c;
            IVar10 = spv::Builder::makeFloatType(pBVar31,uVar34);
          }
          else {
            apcStack_10d8[1] = (code *)0x178225;
            IVar10 = spv::Builder::makeIntegerType(pBVar31,uVar34,false);
          }
          uVar34 = (int)impl + 1;
          apcStack_10d8[1] = (code *)0x178237;
          IVar12 = spv::Builder::makeVectorType(pBVar31,IVar10,uVar34);
          apcStack_10d8[1] = (code *)0x17824c;
          IVar10 = Converter::Impl::build_vector(this,IVar10,(Id *)&local_1068,uVar34);
          pBVar31 = (Builder *)CONCAT44(local_10a4,local_10a8);
          apcStack_10d8[1] = (code *)0x178265;
          IVar12 = spv::Builder::makePointer
                             ((Builder *)CONCAT44(local_10a4,local_10a8),StorageClassStorageBuffer,
                              IVar12);
          apcStack_10d8[1] = (code *)0x178274;
          pOVar22 = Converter::Impl::allocate(this,OpAccessChain,IVar12);
          apcStack_10d8[1] = (code *)0x178283;
          Operation::add_id(pOVar22,(Id)local_10b0);
          apcStack_10d8[1] = (code *)0x178292;
          IVar12 = spv::Builder::makeIntegerType(pBVar31,0x20,false);
          apcStack_10d8[1] = (code *)0x1782a0;
          IVar12 = spv::Builder::makeIntConstant(pBVar31,IVar12,0,false);
          apcStack_10d8[1] = (code *)0x1782aa;
          Operation::add_id(pOVar22,IVar12);
          apcStack_10d8[1] = (code *)0x1782b7;
          Operation::add_id(pOVar22,(Id)local_1090);
          apcStack_10d8[1] = (code *)0x1782c4;
          Converter::Impl::add(this,pOVar22,false);
          if (*(char *)(uVar37 + 0x29) == '\x01') {
            apcStack_10d8[1] = (code *)0x1782e1;
            spv::Builder::addDecoration(pBVar31,pOVar22->id,DecorationNonUniform,-1);
          }
          apcStack_10d8[1] = (code *)0x1782ee;
          pOVar21 = Converter::Impl::allocate(this,OpStore);
          apcStack_10d8[1] = (code *)0x1782fd;
          Operation::add_id(pOVar21,pOVar22->id);
          apcStack_10d8[1] = (code *)0x178307;
          Operation::add_id(pOVar21,IVar10);
          apcStack_10d8[1] = (code *)0x177f24;
          Converter::Impl::add(this,pOVar21,*(bool *)(uVar37 + 0x2b));
          goto LAB_001781c6;
        }
        bVar8 = (char)((ulong)local_10b0 >> 0x20) * '\x02' + 1;
      }
      puVar33 = (undefined8 *)0x0;
      pCVar15 = local_1098;
      pBVar31 = (Builder *)(ulong)(bVar8 - 1);
    case '\x18':
switchD_001764a9_caseD_18:
      do {
        if (((uint)pCVar15 >> ((uint)puVar33 & 0x1f) & 1) != 0) goto code_r0x00177f75;
        puVar33 = (undefined8 *)((long)puVar33 + 1);
        pCVar15 = local_1098;
      } while (puVar33 != (undefined8 *)0x4);
LAB_001781c6:
      if (local_10b8._7_1_ == '\n') {
        local_1078 = (mapped_type *)CONCAT44(local_1078._4_4_,0x38);
        apcStack_10d8[1] = (code *)0x1781e9;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)(CONCAT44(local_10a4,local_10a8) + 0xa8),(Capability *)&local_1078);
      }
      return true;
    case '\x16':
switchD_001764a9_caseD_16:
      if (!bVar7) {
        uVar9 = (*(code *)((long)&switchD_00177fab::switchdataD_001c7860 +
                          (long)(int)(&switchD_00177fab::switchdataD_001c7860)[(long)pBVar31]))();
        return (bool)uVar9;
      }
code_r0x00177f7c:
      uVar9 = (*(code *)((long)&switchD_00177f8f::switchdataD_001c787c +
                        (long)(int)(&switchD_00177f8f::switchdataD_001c787c)[(long)pBVar31]))();
      return (bool)uVar9;
    default:
      if ((ulong)(long)(int)(&switchD_00175bbf::switchdataD_001c7834)[uVar28] < 0xffffffffffe387cc
          && !bVar7) goto code_r0x001c782a;
code_r0x001c783e:
      *(int *)((long)puVar33 + -10) = *(int *)((long)puVar33 + -10) + -1;
      out(uVar27,(char)pCVar15);
      piVar23 = (int *)((ulong)(TVar11 - VoidTyID) - 10);
      *piVar23 = *piVar23 + -1;
      piVar23 = (int *)((long)&this[-0x27a39].uav_index_to_offset.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start + 6);
      *piVar23 = *piVar23 + 1;
      halt_baddata();
    }
    apcStack_10d8[1] = (code *)0x176710;
    IVar10 = spv::Builder::makeFloatType(local_10a0,iVar30);
  }
  else {
    puVar26 = &switchD_001766ba::switchdataD_001c7818;
    piVar23 = (int *)((long)&switchD_001766ba::switchdataD_001c7818 +
                     (long)(int)(&switchD_001766ba::switchdataD_001c7818)[uVar28]);
    bVar7 = SUB81(piVar23,0);
    switch(cVar5) {
    case '\0':
      goto switchD_001764a9_caseD_0;
    case '\x02':
      iVar30 = 0x10;
      break;
    case '\x04':
      iVar30 = 0x20;
      break;
    case '\x06':
      iVar30 = 0x40;
      break;
    default:
      return bVar7;
    case '\x0e':
      uVar34 = (int)piVar23 + *piVar23;
      *(char *)(ulong)uVar34 = *(char *)(ulong)uVar34 + (char)uVar34;
      apcStack_10d8[1] = (code *)0x1776fc;
      IVar10 = build_accumulate_offsets(pIVar35,ids,(uint)uVar29);
      uVar29 = (ulong)IVar10;
      bVar7 = (int)this == 0;
      goto switchD_001764a9_caseD_8;
    case '\x10':
      out(0x20,(int)piVar23);
      goto LAB_001779ee;
    case '\x12':
      goto switchD_001764a9_caseD_12;
    case '\x14':
      pCVar15 = local_1098;
      goto switchD_001764a9_caseD_18;
    case '\x16':
      ppcVar32 = apcStack_10d8 + 1;
      cVar5 = '\x03';
      puVar4 = puVar33;
      do {
        puVar4 = puVar4 + -1;
        ppcVar32 = ppcVar32 + -1;
        *ppcVar32 = (code *)*puVar4;
        cVar5 = cVar5 + -1;
        apcStack_10d8[1] = (code *)puVar33;
      } while ('\0' < cVar5);
      goto code_r0x00177f7c;
    case '\x18':
      *(char *)piVar23 = (char)*piVar23 + bVar7;
code_r0x00177f75:
      bVar7 = (int)local_10a0 == 4;
      goto switchD_001764a9_caseD_16;
    case '\x1a':
    case '\x1c':
    case '\x1e':
      halt_baddata();
    case ' ':
    case '\"':
      *(char *)&pIVar35->bitcode_parser = (char)*ids;
      out(uVar27,bVar7);
      uVar9 = (*(code *)0xe566fffa)
                        ((long)pIVar35 + (ulong)bVar8 * -2 + 1,(long)ids + (ulong)bVar8 * -2 + 1);
      return (bool)uVar9;
    case '$':
      out(uVar27,bVar7);
code_r0x001c782a:
      uVar9 = (*(code *)(ulong)*(uint *)((long)puVar26 + -10))();
      return (bool)uVar9;
    case '&':
      pCVar15 = (CallInst *)(ulong)((short)piVar23 / (short)in_R10B & 0xff);
      goto code_r0x001c783e;
    case '(':
      apcStack_10d8[1] = (code *)0x1c785d;
      (*(code *)&uStack_10c8)();
      halt_baddata();
    }
    apcStack_10d8[1] = (code *)0x176723;
    IVar10 = spv::Builder::makeIntegerType(local_10a0,iVar30,false);
  }
  local_10b8 = pIVar36;
  if (local_1080 != 0) {
    apcStack_10d8[1] = (code *)0x176740;
    IVar10 = spv::Builder::makeVectorType(pBVar31,IVar10,uVar34);
  }
  SVar2 = local_10b0->storage;
  apcStack_10d8[1] = (code *)0x176757;
  local_1088 = LLVMBC::Type::getStructElementType((Type *)local_1068.tween_id,0);
  apcStack_10d8[1] = (code *)0x176764;
  TVar11 = LLVMBC::Type::getTypeID(local_1088);
  bVar8 = 1;
  if (TVar11 == IntegerTyID) {
    apcStack_10d8[1] = (code *)0x176776;
    bVar7 = type_is_16bit(local_1088);
    if ((bVar7) && (((ExecutionModeMeta *)((long)impl + 0x5a0))->native_16bit_operations == false))
    {
      bVar8 = ((anon_struct_296_58_ac09dcaa_for_options *)((long)impl + 0xb08))->
              min_precision_prefer_native_16bit;
    }
    else {
      bVar8 = 0;
    }
  }
  uStack_10c8 = CONCAT44(IVar10,(undefined4)uStack_10c8);
  uVar34 = (local_10c0 & 0x10) >> 4;
  apcStack_10d8[1] = (code *)0x1767b3;
  TVar11 = LLVMBC::Type::getTypeID(local_1090);
  pBVar31 = local_10a0;
  local_1070 = (uint)bVar8;
  if (TVar11 == DoubleTyID) {
    local_1070 = 0;
  }
  local_1068.tween_id = CONCAT44(local_1068.tween_id._4_4_,uVar34);
  if (((byte)uVar34 & SVar2 == StorageClassStorageBuffer) == 1) {
    apcStack_10d8[1] = (code *)0x1767d6;
    p_Var18 = get_thread_log_callback();
    if (p_Var18 == (LoggingCallback)0x0) {
      apcStack_10d8[1] = (code *)0x176e39;
      emit_buffer_load_instruction();
    }
    else {
      uStack_1018 = 0x62;
      uStack_1017 = 0x6361;
      uStack_1015 = 0x283a3e202e6b;
      uStack_100f = 10;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x61707320646e6120;
      uStack_1020 = 0x72;
      uStack_101f = 0x6573;
      uStack_101d = 0x6465656620;
      uVar38._0_1_ = 's';
      uVar38._1_1_ = 'e';
      uVar38._2_1_ = ' ';
      uVar38._3_1_ = 'S';
      uVar39._0_1_ = 'S';
      uVar39._1_1_ = 'B';
      uVar39._2_1_ = 'O';
      uVar39._3_1_ = 's';
LAB_00176809:
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x7520746f6e6e6143;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar39,uVar38);
      apcStack_10d8[1] = (code *)0x176812;
      pvVar24 = get_thread_log_callback_userdata();
      apcStack_10d8[1] = (code *)0x17681f;
      (*p_Var18)(pvVar24,Error,(char *)&local_1038);
    }
    return false;
  }
  if (SVar2 == StorageClassStorageBuffer) {
    apcStack_10d8[1] = (code *)0x176849;
    IVar10 = spv::Builder::makePointer(local_10a0,StorageClassStorageBuffer,uStack_10c8._4_4_);
    local_1090 = (Type *)CONCAT44(local_1090._4_4_,IVar10);
    if ((int)this != 0) {
      pIVar35 = (Impl *)0x0;
      do {
        if ((local_1080 == 0) && ((local_1078->access_mask >> ((uint)pIVar35 & 0x1f) & 1) == 0)) {
          apcStack_10d8[1] = (code *)0x17695c;
          IVar10 = spv::Builder::createUndefined(pBVar31,uStack_10c8._4_4_);
        }
        else {
          apcStack_10d8[1] = (code *)0x176885;
          pOVar22 = Converter::Impl::allocate(impl,OpAccessChain,(Id)local_1090);
          apcStack_10d8[1] = (code *)0x176894;
          Operation::add_id(pOVar22,local_10a4);
          apcStack_10d8[1] = (code *)0x1768a3;
          IVar10 = spv::Builder::makeIntegerType(pBVar31,0x20,false);
          apcStack_10d8[1] = (code *)0x1768b1;
          IVar10 = spv::Builder::makeIntConstant(pBVar31,IVar10,0,false);
          apcStack_10d8[1] = (code *)0x1768bb;
          Operation::add_id(pOVar22,IVar10);
          apcStack_10d8[1] = (code *)0x1768cb;
          IVar10 = Converter::Impl::build_offset(impl,local_1050.index_id,(uint)pIVar35);
          apcStack_10d8[1] = (code *)0x1768d5;
          Operation::add_id(pOVar22,IVar10);
          apcStack_10d8[1] = (code *)0x1768e2;
          Converter::Impl::add(impl,pOVar22,false);
          if (local_10b0->non_uniform == true) {
            apcStack_10d8[1] = (code *)0x176903;
            spv::Builder::addDecoration(pBVar31,pOVar22->id,DecorationNonUniform,-1);
          }
          apcStack_10d8[1] = (code *)0x176914;
          pOVar21 = Converter::Impl::allocate(impl,OpLoad,uStack_10c8._4_4_);
          apcStack_10d8[1] = (code *)0x176923;
          Operation::add_id(pOVar21,pOVar22->id);
          apcStack_10d8[1] = (code *)0x176937;
          Converter::Impl::add(impl,pOVar21,local_10b0->rov);
          IVar10 = pOVar21->id;
        }
        *(Id *)((long)&local_1068.type + (long)pIVar35 * 4) = IVar10;
        pIVar35 = (Impl *)((long)&pIVar35->bitcode_parser + 1);
      } while (this != pIVar35);
    }
    if (local_1080 == 0) {
LAB_00176cbf:
      apcStack_10d8[1] = (code *)0x176cd5;
      IVar10 = Converter::Impl::build_vector
                         (impl,uStack_10c8._4_4_,(Id *)&local_1068,(uint)local_10b8);
      pTVar19 = local_1088;
    }
    else {
      pTVar19 = local_1088;
      IVar10 = (Id)local_1068.type;
    }
  }
  else {
    apcStack_10d8[1] = (code *)0x176972;
    local_10b9 = spv::Builder::isStorageImageType(local_10a0,local_10a8);
    IVar10 = uStack_10c8._4_4_;
    apcStack_10d8[1] = (code *)0x17698b;
    local_10a8 = spv::Builder::makeVectorType(pBVar31,uStack_10c8._4_4_,4);
    pIVar35 = local_10b8;
    IVar12 = 0;
    local_106c = 0;
    if ((local_10c0 & 0x10) != 0) {
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      apcStack_10d8[1] = (code *)0x1769c7;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           &(((CallInst *)
             local_1038.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
      *(Id *)&(((CallInst *)
               local_1038.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
           IVar10;
      *(Id *)((long)&(((CallInst *)
                      local_1038.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                     type + 4) = local_10a8;
      apcStack_10d8[1] = (code *)0x1769f5;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1038.
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_106c = Converter::Impl::get_struct_type(impl,&local_1038,0,"SparseTexel");
      if ((CallInst *)
          local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
        apcStack_10d8[1] = (code *)0x176a07;
        free_in_thread(local_1038.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((int)pIVar35 != 0) {
      local_1090 = (Type *)((ulong)local_10b8 & 0xffffffff);
      bVar8 = 1;
      pTVar19 = (Type *)0x0;
      IVar12 = 0;
      do {
        if ((local_1078->access_mask >> ((uint)pTVar19 & 0x1f) & 1) == 0) {
          apcStack_10d8[1] = (code *)0x176b78;
          IVar10 = spv::Builder::makeIntegerType(pBVar31,0x20,false);
          apcStack_10d8[1] = (code *)0x176b82;
          IVar10 = spv::Builder::createUndefined(pBVar31,IVar10);
        }
        else {
          bVar8 = bVar8 & (byte)local_1068.tween_id;
          local_1080 = CONCAT71(local_1080._1_7_,bVar8);
          OVar14 = OpImageRead;
          if (bVar8 != 0) {
            OVar14 = OpImageSparseRead;
          }
          IVar10 = local_10a8;
          OVar13 = OpImageFetch;
          if (bVar8 != 0) {
            IVar10 = local_106c;
            OVar13 = OpImageSparseFetch;
          }
          if (local_10b9 != '\0') {
            OVar13 = OVar14;
          }
          apcStack_10d8[1] = (code *)0x176a73;
          pOVar22 = Converter::Impl::allocate(impl,OVar13,IVar10);
          local_1048._0_4_ = local_10a4;
          apcStack_10d8[1] = (code *)0x176a91;
          local_1048._4_4_ = Converter::Impl::build_offset(impl,local_1050.index_id,(uint)pTVar19);
          local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1048;
          local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
          ._M_impl.super__Vector_impl_data._M_finish = (ValueKind *)0x2;
          apcStack_10d8[1] = (code *)0x176ac4;
          Operation::add_ids(pOVar22,(initializer_list<unsigned_int> *)&local_1038);
          apcStack_10d8[1] = (code *)0x176ad8;
          Converter::Impl::add(impl,pOVar22,local_10b0->rov);
          type_id = uStack_10c8._4_4_;
          apcStack_10d8[1] = (code *)0x176af0;
          pOVar21 = Converter::Impl::allocate(impl,OpCompositeExtract,uStack_10c8._4_4_);
          apcStack_10d8[1] = (code *)0x176afe;
          Operation::add_id(pOVar21,pOVar22->id);
          apcStack_10d8[1] = (code *)0x176b08;
          Operation::add_literal(pOVar21,0);
          apcStack_10d8[1] = (code *)0x176b15;
          Converter::Impl::add(impl,pOVar21,false);
          IVar10 = pOVar21->id;
          if ((char)local_1080 == '\x01') {
            apcStack_10d8[1] = (code *)0x176b30;
            pOVar21 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
            apcStack_10d8[1] = (code *)0x176b3e;
            Operation::add_id(pOVar21,pOVar22->id);
            apcStack_10d8[1] = (code *)0x176b4b;
            Operation::add_literal(pOVar21,1);
            apcStack_10d8[1] = (code *)0x176b55;
            Operation::add_literal(pOVar21,0);
            apcStack_10d8[1] = (code *)0x176b62;
            Converter::Impl::add(impl,pOVar21,false);
            IVar12 = IVar10;
            IVar10 = pOVar21->id;
          }
          bVar8 = 0;
          pBVar31 = local_10a0;
        }
        *(Id *)((long)&local_1068.type + (long)pTVar19 * 4) = IVar10;
        pTVar19 = (Type *)((long)&pTVar19->context + 1);
      } while (local_1090 != pTVar19);
    }
    if ((local_10c0 & 0x10) == 0) goto LAB_00176cbf;
    apcStack_10d8[1] = (code *)0x176bca;
    pOVar22 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)local_1098);
    pTVar19 = local_1088;
    if (((char)local_1070 != '\0') && ((uint)local_10b8 != 0)) {
      local_10b0 = (mapped_type *)((ulong)local_10b8 & 0xffffffff);
      lVar25 = 0;
      do {
        apcStack_10d8[1] = (code *)0x176bf8;
        IVar10 = Converter::Impl::get_type_id(impl,pTVar19,0);
        apcStack_10d8[1] = (code *)0x176c07;
        pOVar21 = Converter::Impl::allocate(impl,OpBitcast,IVar10);
        apcStack_10d8[1] = (code *)0x176c16;
        Operation::add_id(pOVar21,*(Id *)((long)&local_1068.type + lVar25 * 4));
        apcStack_10d8[1] = (code *)0x176c23;
        Converter::Impl::add(impl,pOVar21,false);
        *(Id *)((long)&local_1068.type + lVar25 * 4) = pOVar21->id;
        lVar25 = lVar25 + 1;
      } while (local_10b0 != (mapped_type *)lVar25);
    }
    if ((uint)local_10b8 != 0) {
      uVar29 = (ulong)local_10b8 & 0xffffffff;
      uVar37 = 0;
      do {
        apcStack_10d8[1] = (code *)0x176c4f;
        Operation::add_id(pOVar22,*(Id *)((long)&local_1068.type + uVar37 * 4));
        uVar37 = uVar37 + 1;
      } while (uVar29 != uVar37);
    }
    pTVar19 = local_1088;
    pBVar31 = local_10a0;
    if ((uint)local_10b8 < 4) {
      iVar30 = (uint)local_10b8 - 4;
      do {
        apcStack_10d8[1] = (code *)0x176c7d;
        IVar10 = Converter::Impl::get_type_id(impl,pTVar19,0);
        apcStack_10d8[1] = (code *)0x176c87;
        IVar10 = spv::Builder::createUndefined(pBVar31,IVar10);
        apcStack_10d8[1] = (code *)0x176c91;
        Operation::add_id(pOVar22,IVar10);
        iVar30 = iVar30 + 1;
      } while (iVar30 != 0);
    }
    apcStack_10d8[1] = (code *)0x176ca0;
    Operation::add_id(pOVar22,IVar12);
    apcStack_10d8[1] = (code *)0x176cb0;
    Converter::Impl::add(impl,pOVar22,false);
    IVar10 = 0;
  }
  instruction = local_1098;
  if ((local_10c0 & 0x10) == 0) {
    if ((char)local_1070 != '\0') {
      apcStack_10d8[1] = (code *)0x176d07;
      bVar7 = type_is_16bit(pTVar19);
      if (((bVar7) &&
          (((ExecutionModeMeta *)((long)impl + 0x5a0))->native_16bit_operations == false)) &&
         (((anon_struct_296_58_ac09dcaa_for_options *)((long)impl + 0xb08))->
          min_precision_prefer_native_16bit == true)) {
        apcStack_10d8[1] = (code *)0x176d2f;
        TVar11 = LLVMBC::Type::getTypeID(pTVar19);
        uVar34 = (uint)local_10b8;
        if (TVar11 == HalfTyID) {
          apcStack_10d8[1] = (code *)0x176d55;
          IVar12 = Converter::Impl::get_type_id(impl,F32,1,uVar34,false);
          apcStack_10d8[1] = (code *)0x176d64;
          pOVar22 = Converter::Impl::allocate(impl,OpBitcast,IVar12);
          apcStack_10d8[1] = (code *)0x176d72;
          Operation::add_id(pOVar22,IVar10);
          apcStack_10d8[1] = (code *)0x176d7f;
          Converter::Impl::add(impl,pOVar22,false);
          IVar10 = pOVar22->id;
          apcStack_10d8[1] = (code *)0x176d9b;
          IVar12 = Converter::Impl::get_type_id(impl,F16,1,uVar34,false);
          OVar14 = OpFConvert;
        }
        else {
          apcStack_10d8[1] = (code *)0x176e55;
          IVar12 = Converter::Impl::get_type_id(impl,U16,1,uVar34,false);
          OVar14 = OpUConvert;
        }
      }
      else {
        apcStack_10d8[1] = (code *)0x176db2;
        IVar12 = Converter::Impl::get_type_id(impl,pTVar19,0);
        apcStack_10d8[1] = (code *)0x176dc1;
        IVar12 = Converter::Impl::build_vector_type(impl,IVar12,(uint)local_10b8);
        OVar14 = OpBitcast;
      }
      apcStack_10d8[1] = (code *)0x176dd0;
      pOVar22 = Converter::Impl::allocate(impl,OVar14,IVar12);
      apcStack_10d8[1] = (code *)0x176dde;
      Operation::add_id(pOVar22,IVar10);
      apcStack_10d8[1] = (code *)0x176deb;
      Converter::Impl::add(impl,pOVar22,false);
      IVar10 = pOVar22->id;
    }
    apcStack_10d8[1] = (code *)0x176dfd;
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar10);
    uVar28 = (uint)local_10b8;
LAB_00176e08:
    apcStack_10d8[1] = (code *)0x176e0d;
    build_exploded_composite_from_vector(impl,&instruction->super_Instruction,uVar28);
  }
  local_1078->forced_composite = false;
  return true;
}

Assistant:

bool emit_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::BufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;

	// Leave no gaps in the access mask to aid vectorization.
	// For reads, we can safely read components we not strictly need to read.
	uint32_t smeared_access_mask;

	if (meta.storage != spv::StorageClassUniformConstant)
	{
		smeared_access_mask = access_meta.access_mask & 0xfu;
		smeared_access_mask |= smeared_access_mask >> 1u;
		smeared_access_mask |= smeared_access_mask >> 2u;
	}
	else
		smeared_access_mask = 1;

	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (sparse)
		{
			LOGE("Cannot use BDA and sparse feedback. >:(\n");
			return false;
		}

		// We don't know more about alignment in SM 5.1 BufferStore.
		// We know the type must be 32-bit however ...
		// Might be possible to do some fancy analysis to deduce a better alignment.

		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta,
		                                             smeared_access_mask, 4);
	}

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	bool raw_access_chain = buffer_access_is_raw_access_chain(impl, meta) && !sparse;
	if (raw_access_chain)
		return emit_buffer_load_raw_chain_instruction(impl, instruction, meta, access_meta);

	auto *result_type = instruction->getType();
	auto *target_type = result_type->getStructElementType(0);

	bool is_typed = meta.kind == DXIL::ResourceKind::TypedBuffer;
	auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id,
	                                  result_type->getStructElementType(0),
	                                  smeared_access_mask);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, target_type);
	RawType raw_type = target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID ?
	                   RawType::Float : RawType::Integer;

	image_id = get_buffer_alias_handle(impl, meta, image_id, raw_type, width, access.raw_vec_size);
	bool vectorized_load = access.raw_vec_size != RawVecSize::V1;

	// Sparse information is stored in the 5th component.
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (!is_typed)
	{
		// Unroll up to 4 loads. Ideally, we'd probably use physical_storage_buffer here, but unfortunately we have no indication
		// how many components we need to load here, and the number of components we load is not necessarily constant,
		// so we cannot reliably encode this information in the SRV.
		// The best we can do is to infer it from stride if we can.
		//unsigned conservative_num_elements = std::min(access.num_components, std::min(4u, access_meta.components));
		unsigned conservative_num_elements = 0;
		unsigned vecsize = raw_vecsize_to_vecsize(access.raw_vec_size);

		if (vectorized_load)
			conservative_num_elements = vecsize;
		else
		{
			for (unsigned i = 0; i < 4; i++)
				if ((access_meta.access_mask & (1u << i)) != 0)
					conservative_num_elements = i + 1;
		}

		spv::Id component_ids[4] = {};

		spv::Id extracted_id_type = raw_type == RawType::Integer ?
		                            builder.makeUintType(raw_width_to_bits(width)) :
		                            builder.makeFloatType(raw_width_to_bits(width));

		if (vectorized_load)
			extracted_id_type = builder.makeVectorType(extracted_id_type, vecsize);

		spv::Id constructed_id = 0;
		bool ssbo = meta.storage == spv::StorageClassStorageBuffer;

		auto *element_type = result_type->getStructElementType(0);
		bool need_cast = (element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID) ||
		                 (type_is_16bit(element_type) && !impl.execution_mode_meta.native_16bit_operations &&
		                  impl.options.min_precision_prefer_native_16bit);

		// FP64 is handled directly.
		if (target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
			need_cast = false;

		if (ssbo && sparse)
		{
			LOGE("Cannot use SSBOs and sparse feedback. >:(\n");
			return false;
		}

		if (ssbo)
		{
			spv::Id ptr_type = builder.makePointer(spv::StorageClassStorageBuffer, extracted_id_type);
			for (unsigned i = 0; i < (vectorized_load ? 1 : conservative_num_elements); i++)
			{
				if (vectorized_load || (access_meta.access_mask & (1u << i)) != 0)
				{
					auto *chain_op = impl.allocate(spv::OpAccessChain, ptr_type);
					chain_op->add_id(image_id);
					chain_op->add_id(builder.makeUintConstant(0));
					chain_op->add_id(impl.build_offset(access.index_id, i));
					impl.add(chain_op);

					if (meta.non_uniform)
						builder.addDecoration(chain_op->id, spv::DecorationNonUniform);

					auto *load_op = impl.allocate(spv::OpLoad, extracted_id_type);
					load_op->add_id(chain_op->id);
					impl.add(load_op, meta.rov);
					component_ids[i] = load_op->id;
				}
				else
					component_ids[i] = builder.createUndefined(extracted_id_type);
			}

			if (vectorized_load)
				constructed_id = component_ids[0];
			else
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
		}
		else
		{
			bool is_uav = builder.isStorageImageType(image_type_id);

			spv::Id loaded_id_type = builder.makeVectorType(extracted_id_type, 4);
			spv::Id sparse_code_id = 0;
			spv::Id sparse_loaded_id_type = 0;
			if (sparse)
				sparse_loaded_id_type = impl.get_struct_type({ extracted_id_type, loaded_id_type }, 0, "SparseTexel");

			bool first_load = true;
			for (unsigned i = 0; i < conservative_num_elements; i++)
			{
				if (access_meta.access_mask & (1u << i))
				{
					// There is no sane way to combine sparse feedback code, since it's completely opaque to application.
					// We could hypothetically return a vector of status code and deal with it magically, but let's not go there ...
					spv::Op opcode;
					if (is_uav)
						opcode = (sparse && first_load) ? spv::OpImageSparseRead : spv::OpImageRead;
					else
						opcode = (sparse && first_load) ? spv::OpImageSparseFetch : spv::OpImageFetch;

					Operation *loaded_op =
					    impl.allocate(opcode, (sparse && first_load) ? sparse_loaded_id_type : loaded_id_type);
					loaded_op->add_ids({ image_id, impl.build_offset(access.index_id, i) });
					impl.add(loaded_op, meta.rov);

					if (sparse && first_load)
					{
						auto *code_extract_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						code_extract_op->add_id(loaded_op->id);
						code_extract_op->add_literal(0);
						impl.add(code_extract_op);
						sparse_code_id = code_extract_op->id;

						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(1);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					else
					{
						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					first_load = false;
				}
				else
					component_ids[i] = builder.createUndefined(builder.makeUintType(32));
			}

			if (sparse)
			{
				Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction);

				if (need_cast)
				{
					for (unsigned i = 0; i < conservative_num_elements; i++)
					{
						auto *bitcast_op =
						    impl.allocate(spv::OpBitcast, impl.get_type_id(element_type));
						bitcast_op->add_id(component_ids[i]);
						impl.add(bitcast_op);
						component_ids[i] = bitcast_op->id;
					}
				}

				for (unsigned i = 0; i < conservative_num_elements; i++)
					op->add_id(component_ids[i]);
				for (unsigned i = conservative_num_elements; i < 4; i++)
					op->add_id(builder.createUndefined(impl.get_type_id(element_type)));
				op->add_id(sparse_code_id);
				impl.add(op);
			}
			else
			{
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
			}
		}

		if (!sparse)
		{
			if (need_cast)
			{
				spv::Id casted_id;

				if (type_is_16bit(element_type) &&
				    !impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit)
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *bitcast_op = impl.allocate(
							spv::OpBitcast,
							impl.get_type_id(DXIL::ComponentType::F32, 1, conservative_num_elements));
						bitcast_op->add_id(constructed_id);
						impl.add(bitcast_op);
						casted_id = bitcast_op->id;

						Operation *narrow_op = impl.allocate(
							spv::OpFConvert,
							impl.get_type_id(DXIL::ComponentType::F16, 1, conservative_num_elements));
						narrow_op->add_id(casted_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
					else
					{
						Operation *narrow_op = impl.allocate(
							spv::OpUConvert,
							impl.get_type_id(DXIL::ComponentType::U16, 1, conservative_num_elements));
						narrow_op->add_id(constructed_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
				}
				else
				{
					Operation *op = impl.allocate(
						spv::OpBitcast, impl.build_vector_type(impl.get_type_id(element_type), conservative_num_elements));
					op->add_id(constructed_id);
					impl.add(op);
					casted_id = op->id;
				}

				impl.rewrite_value(instruction, casted_id);
			}
			else
				impl.rewrite_value(instruction, constructed_id);

			build_exploded_composite_from_vector(impl, instruction, conservative_num_elements);
		}

		access_meta.forced_composite = false;
	}
	else
	{
		bool is_uav = builder.isStorageImageType(image_type_id);

		auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
		spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
		spv::Id sample_type;

		if (sparse)
			sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
		else
			sample_type = texel_type;

		spv::Op opcode;
		if (is_uav)
			opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
		else
			opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

		Operation *op = impl.allocate(opcode, instruction, sample_type);

		if (!sparse)
			impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

		op->add_ids({ image_id, access.index_id });
		impl.add(op, meta.rov);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}